

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub2.c
# Opt level: O3

int Gia_ManVerifyTwoTruths(Gia_Man_t *p1,Gia_Man_t *p2)

{
  Gia_Obj_t *pGVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  uint uVar5;
  Vec_Int_t *pVVar6;
  word wVar7;
  word wVar8;
  ulong uVar9;
  Gia_Obj_t *pGVar10;
  
  pVVar6 = p1->vCos;
  if (pVVar6->nSize != p2->vCos->nSize) {
    __assert_fail("Gia_ManCoNum(p1) == Gia_ManCoNum(p2)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/giaResub2.c"
                  ,0x507,"int Gia_ManVerifyTwoTruths(Gia_Man_t *, Gia_Man_t *)");
  }
  if (pVVar6->nSize < 1) {
    uVar5 = 1;
  }
  else {
    uVar9 = 0;
    bVar4 = false;
    do {
      iVar2 = pVVar6->pArray[uVar9];
      if (((long)iVar2 < 0) || (p1->nObjs <= iVar2)) {
LAB_007b2731:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      if ((long)p2->vCos->nSize <= (long)uVar9) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar3 = p2->vCos->pArray[uVar9];
      if (((long)iVar3 < 0) || (p2->nObjs <= iVar3)) goto LAB_007b2731;
      pGVar10 = p1->pObjs + iVar2;
      pGVar1 = p2->pObjs + iVar3;
      wVar7 = Gia_LutComputeTruth66_rec(p1,pGVar10 + -(*(ulong *)pGVar10 & 0x1fffffff));
      wVar8 = Gia_LutComputeTruth66_rec(p2,pGVar1 + -(*(ulong *)pGVar1 & 0x1fffffff));
      if (((long)(*(ulong *)pGVar10 << 0x22) >> 0x3f ^ wVar7) !=
          ((long)(*(ulong *)pGVar1 << 0x22) >> 0x3f ^ wVar8)) {
        printf("Verification failed for output %d (out of %d).\n",uVar9 & 0xffffffff,
               (ulong)(uint)p1->vCos->nSize);
        bVar4 = true;
      }
      uVar9 = uVar9 + 1;
      pVVar6 = p1->vCos;
    } while ((long)uVar9 < (long)pVVar6->nSize);
    uVar5 = (uint)!bVar4;
  }
  return uVar5;
}

Assistant:

int Gia_ManVerifyTwoTruths( Gia_Man_t * p1, Gia_Man_t * p2 )
{
    int i, fFailed = 0;
    assert( Gia_ManCoNum(p1) == Gia_ManCoNum(p2) );
    for ( i = 0; i < Gia_ManCoNum(p1); i++ )
    {
        Gia_Obj_t * pPo1 = Gia_ManCo(p1, i);
        Gia_Obj_t * pPo2 = Gia_ManCo(p2, i);
        word word1 = Gia_LutComputeTruth66_rec( p1, Gia_ObjFanin0(pPo1) );
        word word2 = Gia_LutComputeTruth66_rec( p2, Gia_ObjFanin0(pPo2) );
        if ( Gia_ObjFaninC0(pPo1) )
            word1 = ~word1;
        if ( Gia_ObjFaninC0(pPo2) )
            word2 = ~word2;
        if ( word1 != word2 )
        {
            //Dau_DsdPrintFromTruth( &word1, 6 );
            //Dau_DsdPrintFromTruth( &word2, 6 );
            printf( "Verification failed for output %d (out of %d).\n", i, Gia_ManCoNum(p1) );
            fFailed = 1;
        }
    }
//    if ( !fFailed )
//        printf( "Verification succeeded for %d outputs.\n", Gia_ManCoNum(p1) );
    return !fFailed;
}